

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.h
# Opt level: O0

Colori get_color(Colorf col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 local_14;
  undefined4 uStack_10;
  Colorf col_local;
  
  dVar1 = std::floor((double)(ulong)(uint)(col.b * 255.0));
  uStack_10 = col.g;
  dVar2 = std::floor((double)(ulong)(uint)(uStack_10 * 255.0));
  local_14 = col.r;
  dVar3 = std::floor((double)(ulong)(uint)(local_14 * 255.0));
  return (int)SUB84(dVar1,0) << 0x10 | 0xff000000U | (int)SUB84(dVar2,0) << 8 | (int)SUB84(dVar3,0);
}

Assistant:

Colori get_color(Colorf col)
{
#if GAMMA_CORRECTION
    // Gamma correction
    float gamma = 1 / 2.2f;
    col.r = std::pow(clampf(col.r), gamma);
    col.g = std::pow(clampf(col.g), gamma);
    col.b = std::pow(clampf(col.b), gamma);
#endif
    // Convert a valid Colorf to Colori
    return (255 << 24) | ((int)std::floor(col.b * 255) << 16) | ((int)std::floor(col.g * 255) << 8) | (int)std::floor(col.r * 255);
}